

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::TrackEvent::TrackEvent(TrackEvent *this,TrackEvent *param_1)

{
  undefined4 uVar1;
  TrackEvent *param_1_local;
  TrackEvent *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__TrackEvent_009c2450;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->category_iids_,&param_1->category_iids_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->categories_,&param_1->categories_);
  this->name_iid_ = param_1->name_iid_;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  uVar1 = *(undefined4 *)&param_1->field_0x64;
  this->type_ = param_1->type_;
  *(undefined4 *)&this->field_0x64 = uVar1;
  this->track_uuid_ = param_1->track_uuid_;
  this->counter_value_ = param_1->counter_value_;
  this->double_counter_value_ = param_1->double_counter_value_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->extra_counter_track_uuids_,&param_1->extra_counter_track_uuids_);
  std::vector<long,_std::allocator<long>_>::vector
            (&this->extra_counter_values_,&param_1->extra_counter_values_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->extra_double_counter_track_uuids_,&param_1->extra_double_counter_track_uuids_);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->extra_double_counter_values_,&param_1->extra_double_counter_values_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->flow_ids_,&param_1->flow_ids_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->terminating_flow_ids_,&param_1->terminating_flow_ids_);
  std::
  vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  ::vector(&this->debug_annotations_,&param_1->debug_annotations_);
  protozero::CopyablePtr<perfetto::protos::gen::TaskExecution>::CopyablePtr
            (&this->task_execution_,&param_1->task_execution_);
  protozero::CopyablePtr<perfetto::protos::gen::LogMessage>::CopyablePtr
            (&this->log_message_,&param_1->log_message_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorSchedulerState>::CopyablePtr
            (&this->cc_scheduler_state_,&param_1->cc_scheduler_state_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeUserEvent>::CopyablePtr
            (&this->chrome_user_event_,&param_1->chrome_user_event_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeKeyedService>::CopyablePtr
            (&this->chrome_keyed_service_,&param_1->chrome_keyed_service_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeLegacyIpc>::CopyablePtr
            (&this->chrome_legacy_ipc_,&param_1->chrome_legacy_ipc_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeHistogramSample>::CopyablePtr
            (&this->chrome_histogram_sample_,&param_1->chrome_histogram_sample_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeLatencyInfo>::CopyablePtr
            (&this->chrome_latency_info_,&param_1->chrome_latency_info_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeFrameReporter>::CopyablePtr
            (&this->chrome_frame_reporter_,&param_1->chrome_frame_reporter_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeApplicationStateInfo>::CopyablePtr
            (&this->chrome_application_state_info_,&param_1->chrome_application_state_info_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeRendererSchedulerState>::CopyablePtr
            (&this->chrome_renderer_scheduler_state_,&param_1->chrome_renderer_scheduler_state_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeWindowHandleEventInfo>::CopyablePtr
            (&this->chrome_window_handle_event_info_,&param_1->chrome_window_handle_event_info_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeContentSettingsEventInfo>::CopyablePtr
            (&this->chrome_content_settings_event_info_,
             &param_1->chrome_content_settings_event_info_);
  protozero::CopyablePtr<perfetto::protos::gen::SourceLocation>::CopyablePtr
            (&this->source_location_,&param_1->source_location_);
  this->source_location_iid_ = param_1->source_location_iid_;
  protozero::CopyablePtr<perfetto::protos::gen::ChromeMessagePump>::CopyablePtr
            (&this->chrome_message_pump_,&param_1->chrome_message_pump_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeMojoEventInfo>::CopyablePtr
            (&this->chrome_mojo_event_info_,&param_1->chrome_mojo_event_info_);
  memcpy(&this->timestamp_delta_us_,&param_1->timestamp_delta_us_,0x30);
  protozero::CopyablePtr<perfetto::protos::gen::TrackEvent_LegacyEvent>::CopyablePtr
            (&this->legacy_event_,&param_1->legacy_event_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TrackEvent::TrackEvent(TrackEvent&&) noexcept = default;